

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# init.c
# Opt level: O3

void service_start(service *svc,char *dynamic_args)

{
  char **__argv;
  uint uVar1;
  socketinfo *psVar2;
  int iVar3;
  __pid_t _Var4;
  uint __fd;
  time_t tVar5;
  char *pcVar6;
  int *piVar7;
  char *pcVar8;
  svcenvinfo *psVar9;
  long lVar10;
  char val [64];
  char key [64];
  stat s;
  char *local_308 [8];
  char *local_2c8;
  char acStack_2c0 [8];
  undefined8 local_2b8;
  undefined8 uStack_2b0;
  undefined8 local_2a8;
  undefined8 uStack_2a0;
  undefined8 local_298;
  undefined8 uStack_290;
  stat local_c0;
  
  uVar1 = svc->flags;
  svc->flags = uVar1 & 0xfffffff6;
  svc->time_started = 0;
  if ((uVar1 & 4) != 0) {
    return;
  }
  if (((uVar1 & 0x10) == 0) || ((have_console & 1) != 0)) {
    iVar3 = stat(svc->args[0],&local_c0);
    if (iVar3 != 0) {
      log_write(3,"<3>init: cannot find \'%s\', disabling \'%s\'\n",svc->args[0],svc->name);
      goto LAB_001053ca;
    }
    if ((dynamic_args == (char *)0x0) || ((svc->flags & 2) != 0)) {
      log_write(5,"<5>init: starting \'%s\'\n",svc->name);
      _Var4 = fork();
      if (_Var4 != 0) {
        if (_Var4 < 0) {
          log_write(3,"<3>init: failed to start \'%s\'\n",svc->name);
          svc->pid = 0;
          return;
        }
        tVar5 = gettime();
        svc->time_started = tVar5;
        svc->pid = _Var4;
        *(byte *)&svc->flags = (byte)svc->flags | 4;
        notify_service_state(svc->name,"running");
        return;
      }
      for (psVar9 = svc->envvars; psVar9 != (svcenvinfo *)0x0; psVar9 = psVar9->next) {
        add_environment(psVar9->name,psVar9->value);
      }
      for (psVar2 = svc->sockets; psVar2 != (socketinfo *)0x0; psVar2 = psVar2->next) {
        pcVar6 = psVar2->name;
        iVar3 = strcmp(psVar2->type,"dgram");
        __fd = create_socket(pcVar6,(iVar3 == 0) + 1,psVar2->perm,psVar2->uid,psVar2->gid);
        if (-1 < (int)__fd) {
          local_298 = 0;
          uStack_290 = 0;
          local_2a8 = 0;
          uStack_2a0 = 0;
          local_2b8 = 0;
          uStack_2b0 = 0;
          local_2c8 = (char *)0x5f44494f52444e41;
          builtin_strncpy(acStack_2c0,"SOCKET_",8);
          strlcpy(acStack_2c0 + 7,psVar2->name,0x30);
          snprintf((char *)local_308,0x40,"%d",(ulong)__fd);
          add_environment((char *)&local_2c8,(char *)local_308);
          fcntl(__fd,2,0);
        }
      }
      if ((uVar1 & 0x10) == 0) {
        zap_stdio();
      }
      else {
        setsid();
      }
      _Var4 = getpid();
      setpgid(0,_Var4);
      if (svc->gid != 0) {
        setgid(svc->gid);
      }
      if (svc->nr_supp_gids != 0) {
        setgroups(svc->nr_supp_gids,svc->supp_gids);
      }
      if (svc->uid != 0) {
        setuid(svc->uid);
      }
      __argv = svc->args;
      if (dynamic_args == (char *)0x0) {
        iVar3 = execve(*__argv,__argv,ENV);
        if (iVar3 < 0) {
          pcVar6 = *__argv;
          piVar7 = __errno_location();
          pcVar8 = strerror(*piVar7);
          log_write(3,"<3>init: cannot execve(\'%s\'): %s\n",pcVar6,pcVar8);
        }
      }
      else {
        lVar10 = (long)svc->nargs;
        local_308[0] = strdup(dynamic_args);
        memcpy(&local_2c8,__argv,lVar10 * 8);
        do {
          pcVar6 = strsep(local_308," ");
          if (pcVar6 == (char *)0x0) goto LAB_00105615;
          (&local_2c8)[lVar10] = pcVar6;
          lVar10 = lVar10 + 1;
        } while (lVar10 != 0x40);
        lVar10 = 0x40;
LAB_00105615:
        (&local_2c8)[(int)lVar10] = (char *)0x0;
        execve(*__argv,&local_2c8,ENV);
      }
      _exit(0x7f);
    }
    pcVar6 = svc->args[0];
    pcVar8 = "<3>init: service \'%s\' must be one-shot to use dynamic args, disabling\n";
  }
  else {
    pcVar6 = svc->name;
    pcVar8 = "<3>init: service \'%s\' requires console\n";
  }
  log_write(3,pcVar8,pcVar6);
LAB_001053ca:
  *(byte *)&svc->flags = (byte)svc->flags | 1;
  return;
}

Assistant:

void service_start(struct service *svc, const char *dynamic_args)
{
    struct stat s;
    pid_t pid;
    int needs_console;
    int n;

        /* starting a service removes it from the disabled
         * state and immediately takes it out of the restarting
         * state if it was in there
         */
    svc->flags &= (~(SVC_DISABLED|SVC_RESTARTING));
    svc->time_started = 0;
    
        /* running processes require no additional work -- if
         * they're in the process of exiting, we've ensured
         * that they will immediately restart on exit, unless
         * they are ONESHOT
         */
    if (svc->flags & SVC_RUNNING) {
        return;
    }

    needs_console = (svc->flags & SVC_CONSOLE) ? 1 : 0;
    if (needs_console && (!have_console)) {
        ERROR("service '%s' requires console\n", svc->name);
        svc->flags |= SVC_DISABLED;
        return;
    }

    if (stat(svc->args[0], &s) != 0) {
        ERROR("cannot find '%s', disabling '%s'\n", svc->args[0], svc->name);
        svc->flags |= SVC_DISABLED;
        return;
    }

    if ((!(svc->flags & SVC_ONESHOT)) && dynamic_args) {
        ERROR("service '%s' must be one-shot to use dynamic args, disabling\n",
               svc->args[0]);
        svc->flags |= SVC_DISABLED;
        return;
    }

    NOTICE("starting '%s'\n", svc->name);

    pid = fork();

    if (pid == 0) {
        struct socketinfo *si;
        struct svcenvinfo *ei;
        char tmp[32];
        int fd, sz;

        for (ei = svc->envvars; ei; ei = ei->next)
            add_environment(ei->name, ei->value);

        for (si = svc->sockets; si; si = si->next) {
            int s = create_socket(si->name,
                                  !strcmp(si->type, "dgram") ? 
                                  SOCK_DGRAM : SOCK_STREAM,
                                  si->perm, si->uid, si->gid);
            if (s >= 0) {
                publish_socket(si->name, s);
            }
        }

        if (needs_console) {
            setsid();
//            open_console();
        } else {
            zap_stdio();
        }

#if 0
        for (n = 0; svc->args[n]; n++) {
            INFO("args[%d] = '%s'\n", n, svc->args[n]);
        }
        for (n = 0; ENV[n]; n++) {
            INFO("env[%d] = '%s'\n", n, ENV[n]);
        }
#endif

        setpgid(0, getpid());

    /* as requested, set our gid, supplemental gids, and uid */
        if (svc->gid) {
            setgid(svc->gid);
        }
        if (svc->nr_supp_gids) {
            setgroups(svc->nr_supp_gids, svc->supp_gids);
        }
        if (svc->uid) {
            setuid(svc->uid);
        }

        if (!dynamic_args) {
            if (execve(svc->args[0], (char**) svc->args, (char**) ENV) < 0) {
                ERROR("cannot execve('%s'): %s\n", svc->args[0], strerror(errno));
            }
        } else {
            char *arg_ptrs[SVC_MAXARGS+1];
            int arg_idx = svc->nargs;
            char *tmp = strdup(dynamic_args);
            char *next = tmp;
            char *bword;

            /* Copy the static arguments */
            memcpy(arg_ptrs, svc->args, (svc->nargs * sizeof(char *)));

            while((bword = strsep(&next, " "))) {
                arg_ptrs[arg_idx++] = bword;
                if (arg_idx == SVC_MAXARGS)
                    break;
            }
            arg_ptrs[arg_idx] = '\0';
            execve(svc->args[0], (char**) arg_ptrs, (char**) ENV);
        }
        _exit(127);
    }

    if (pid < 0) {
        ERROR("failed to start '%s'\n", svc->name);
        svc->pid = 0;
        return;
    }

    svc->time_started = gettime();
    svc->pid = pid;
    svc->flags |= SVC_RUNNING;

    notify_service_state(svc->name, "running");
}